

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_process.c
# Opt level: O1

unsigned_long
NonAdaptingProcess(PaUtilBufferProcessor *bp,int *streamCallbackResult,
                  PaUtilChannelDescriptor *hostInputChannels,
                  PaUtilChannelDescriptor *hostOutputChannels,unsigned_long framesToProcess)

{
  void **ppvVar1;
  long *plVar2;
  PaStreamCallbackTimeInfo *pPVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  long lVar10;
  PaUtilChannelDescriptor *pPVar11;
  PaUtilChannelDescriptor *pPVar12;
  uint uVar13;
  ulong uVar14;
  uint uVar15;
  ulong uVar16;
  void **ppvVar17;
  void **ppvVar18;
  void *pvVar19;
  ulong uVar20;
  undefined1 auVar21 [16];
  double dVar22;
  unsigned_long local_68;
  
  if (*streamCallbackResult == 0) {
    ppvVar1 = &bp->tempOutputBuffer;
    local_68 = 0;
    bVar5 = false;
    bVar4 = false;
    do {
      uVar14 = bp->framesPerTempBuffer;
      if (framesToProcess <= bp->framesPerTempBuffer) {
        uVar14 = framesToProcess;
      }
      uVar9 = bp->inputChannelCount;
      uVar15 = (uint)uVar14;
      if ((ulong)uVar9 == 0) {
        ppvVar17 = (void **)0x0;
      }
      else {
        ppvVar18 = (void **)bp->tempInputBuffer;
        if (bp->userInputIsInterleaved == 0) {
          uVar8 = bp->bytesPerUserInputSample;
          if (((bp->userInputSampleFormatIsEqualToHost == 0) || (bp->hostInputIsInterleaved != 0))
             || (bp->hostInputChannels[0]->data == (void *)0x0)) {
            uVar20 = 0;
            uVar16 = 0;
            do {
              bp->tempInputBufferPtrs[uVar16] =
                   (void *)(uVar20 * uVar14 + (long)bp->tempInputBuffer);
              uVar16 = uVar16 + 1;
              uVar20 = (ulong)((int)uVar20 + uVar8);
            } while (uVar9 + (uVar9 == 0) != uVar16);
          }
          else {
            lVar10 = 0;
            do {
              *(undefined8 *)((long)bp->tempInputBufferPtrs + lVar10) =
                   *(undefined8 *)((long)&hostInputChannels->data + lVar10 * 2);
              lVar10 = lVar10 + 8;
            } while ((ulong)uVar9 << 3 != lVar10);
            bVar4 = true;
          }
          uVar8 = uVar8 * uVar15;
          ppvVar17 = bp->tempInputBufferPtrs;
          uVar13 = 1;
        }
        else {
          uVar8 = bp->bytesPerUserInputSample;
          ppvVar17 = ppvVar18;
          uVar13 = uVar9;
          if (((bp->userInputSampleFormatIsEqualToHost != 0) && (bp->hostInputIsInterleaved != 0))
             && ((bp->hostInputChannels[0]->data != (void *)0x0 &&
                 (uVar9 == hostInputChannels->stride)))) {
            ppvVar18 = (void **)hostInputChannels->data;
            bVar4 = true;
            ppvVar17 = ppvVar18;
          }
        }
        if (bp->hostInputChannels[0]->data == (void *)0x0) {
          if (bp->inputChannelCount != 0) {
            uVar9 = 0;
            do {
              (*bp->inputZeroer)(ppvVar18,uVar13,uVar15);
              ppvVar18 = (void **)((long)ppvVar18 + (ulong)uVar8);
              uVar9 = uVar9 + 1;
            } while (uVar9 < bp->inputChannelCount);
          }
        }
        else if (bVar4) {
          uVar8 = bp->bytesPerHostInputSample;
          lVar10 = 0;
          do {
            plVar2 = (long *)((long)&hostInputChannels->data + lVar10);
            *plVar2 = *plVar2 + (ulong)*(uint *)((long)&hostInputChannels->stride + lVar10) *
                                uVar8 * uVar14;
            lVar10 = lVar10 + 0x10;
          } while ((ulong)(uVar9 + (uVar9 == 0)) << 4 != lVar10);
          bVar4 = true;
        }
        else {
          bVar4 = false;
          if (bp->inputChannelCount != 0) {
            uVar20 = 0;
            pPVar11 = hostInputChannels;
            do {
              (*bp->inputConverter)
                        (ppvVar18,uVar13,pPVar11->data,pPVar11->stride,uVar15,&bp->ditherGenerator);
              ppvVar18 = (void **)((long)ppvVar18 + (ulong)uVar8);
              pPVar11->data =
                   (void *)((long)pPVar11->data +
                           (ulong)bp->bytesPerHostInputSample * pPVar11->stride * uVar14);
              uVar20 = uVar20 + 1;
              pPVar11 = pPVar11 + 1;
            } while (uVar20 < bp->inputChannelCount);
          }
        }
      }
      uVar9 = bp->outputChannelCount;
      if ((ulong)uVar9 == 0) {
        pvVar19 = (void *)0x0;
      }
      else {
        if (bp->userOutputIsInterleaved == 0) {
          if ((bp->userOutputSampleFormatIsEqualToHost == 0) || (bp->hostOutputIsInterleaved != 0))
          {
            uVar8 = bp->bytesPerUserOutputSample;
            uVar20 = (ulong)uVar9;
            if (uVar9 < 2) {
              uVar20 = 1;
            }
            uVar9 = 0;
            uVar16 = 0;
            do {
              bp->tempOutputBufferPtrs[uVar16] =
                   (void *)(uVar9 * uVar14 + (long)bp->tempOutputBuffer);
              uVar16 = uVar16 + 1;
              uVar9 = uVar9 + uVar8;
              pPVar11 = (PaUtilChannelDescriptor *)&bp->tempOutputBufferPtrs;
            } while (uVar20 != uVar16);
            goto LAB_0010be7a;
          }
          lVar10 = 0;
          do {
            *(undefined8 *)((long)bp->tempOutputBufferPtrs + lVar10) =
                 *(undefined8 *)((long)&hostOutputChannels->data + lVar10 * 2);
            lVar10 = lVar10 + 8;
          } while ((ulong)uVar9 << 3 != lVar10);
          pPVar12 = (PaUtilChannelDescriptor *)&bp->tempOutputBufferPtrs;
          bVar6 = true;
        }
        else {
          pPVar11 = (PaUtilChannelDescriptor *)ppvVar1;
          if (((bp->userOutputSampleFormatIsEqualToHost == 0) || (bp->hostOutputIsInterleaved == 0))
             || (pPVar12 = hostOutputChannels, bVar6 = true, uVar9 != hostOutputChannels->stride)) {
LAB_0010be7a:
            pPVar12 = pPVar11;
            bVar6 = bVar5;
          }
        }
        bVar5 = bVar6;
        pvVar19 = pPVar12->data;
      }
      iVar7 = (*bp->streamCallback)
                        (ppvVar17,pvVar19,uVar14,bp->timeInfo,bp->callbackStatusFlags,bp->userData);
      *streamCallbackResult = iVar7;
      if (iVar7 != 2) {
        auVar21._8_4_ = (int)(uVar14 >> 0x20);
        auVar21._0_8_ = uVar14;
        auVar21._12_4_ = 0x45300000;
        pPVar3 = bp->timeInfo;
        dVar22 = ((auVar21._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,uVar15) - 4503599627370496.0)) * bp->samplePeriod;
        pPVar3->inputBufferAdcTime = pPVar3->inputBufferAdcTime + dVar22;
        pPVar3->outputBufferDacTime = dVar22 + pPVar3->outputBufferDacTime;
        uVar9 = bp->outputChannelCount;
        if (((ulong)uVar9 != 0) && (bp->hostOutputChannels[0]->data != (void *)0x0)) {
          if (bVar5) {
            uVar15 = bp->bytesPerHostOutputSample;
            lVar10 = 0;
            do {
              plVar2 = (long *)((long)&hostOutputChannels->data + lVar10);
              *plVar2 = *plVar2 + (ulong)*(uint *)((long)&hostOutputChannels->stride + lVar10) *
                                  uVar15 * uVar14;
              lVar10 = lVar10 + 0x10;
            } while ((ulong)uVar9 << 4 != lVar10);
          }
          else {
            if (bp->userOutputIsInterleaved == 0) {
              uVar8 = bp->bytesPerUserOutputSample * uVar15;
              uVar9 = 1;
            }
            else {
              uVar8 = bp->bytesPerUserOutputSample;
            }
            if (bp->outputChannelCount != 0) {
              pvVar19 = bp->tempOutputBuffer;
              uVar20 = 0;
              pPVar11 = hostOutputChannels;
              do {
                (*bp->outputConverter)
                          (pPVar11->data,pPVar11->stride,pvVar19,uVar9,uVar15,&bp->ditherGenerator);
                pvVar19 = (void *)((long)pvVar19 + (ulong)uVar8);
                pPVar11->data =
                     (void *)((long)pPVar11->data +
                             (ulong)bp->bytesPerHostOutputSample * pPVar11->stride * uVar14);
                uVar20 = uVar20 + 1;
                pPVar11 = pPVar11 + 1;
              } while (uVar20 < bp->outputChannelCount);
            }
          }
        }
        local_68 = local_68 + uVar14;
        framesToProcess = framesToProcess - uVar14;
      }
      if (framesToProcess == 0) {
        framesToProcess = 0;
        break;
      }
    } while (*streamCallbackResult == 0);
  }
  else {
    local_68 = 0;
  }
  if (framesToProcess != 0) {
    if (((bp->outputChannelCount != 0) && (bp->hostOutputChannels[0]->data != (void *)0x0)) &&
       (bp->outputChannelCount != 0)) {
      uVar14 = 0;
      do {
        (*bp->outputZeroer)(hostOutputChannels->data,hostOutputChannels->stride,
                            (uint)framesToProcess);
        hostOutputChannels->data =
             (void *)((long)hostOutputChannels->data +
                     (ulong)bp->bytesPerHostOutputSample *
                     hostOutputChannels->stride * framesToProcess);
        uVar14 = uVar14 + 1;
        hostOutputChannels = hostOutputChannels + 1;
      } while (uVar14 < bp->outputChannelCount);
    }
    local_68 = local_68 + framesToProcess;
  }
  return local_68;
}

Assistant:

static unsigned long NonAdaptingProcess( PaUtilBufferProcessor *bp,
        int *streamCallbackResult,
        PaUtilChannelDescriptor *hostInputChannels,
        PaUtilChannelDescriptor *hostOutputChannels,
        unsigned long framesToProcess )
{
    void *userInput, *userOutput;
    unsigned char *srcBytePtr, *destBytePtr;
    unsigned int srcSampleStrideSamples; /* stride from one sample to the next within a channel, in samples */
    unsigned int srcChannelStrideBytes; /* stride from one channel to the next, in bytes */
    unsigned int destSampleStrideSamples; /* stride from one sample to the next within a channel, in samples */
    unsigned int destChannelStrideBytes; /* stride from one channel to the next, in bytes */
    unsigned int i;
    unsigned long frameCount;
    unsigned long framesToGo = framesToProcess;
    unsigned long framesProcessed = 0;
    int skipOutputConvert = 0;
    int skipInputConvert = 0;


    if( *streamCallbackResult == paContinue )
    {
        do
        {
            frameCount = PA_MIN_( bp->framesPerTempBuffer, framesToGo );

            /* configure user input buffer and convert input data (host -> user) */
            if( bp->inputChannelCount == 0 )
            {
                /* no input */
                userInput = 0;
            }
            else /* there are input channels */
            {
                
                destBytePtr = (unsigned char *)bp->tempInputBuffer;

                if( bp->userInputIsInterleaved )
                {
                    destSampleStrideSamples = bp->inputChannelCount;
                    destChannelStrideBytes = bp->bytesPerUserInputSample;

                    /* process host buffer directly, or use temp buffer if formats differ or host buffer non-interleaved,
                     * or if num channels differs between the host (set in stride) and the user (eg with some Alsa hw:) */
                    if( bp->userInputSampleFormatIsEqualToHost && bp->hostInputIsInterleaved
                        && bp->hostInputChannels[0][0].data && bp->inputChannelCount == hostInputChannels[0].stride )
                    {
                        userInput = hostInputChannels[0].data;
                        destBytePtr = (unsigned char *)hostInputChannels[0].data;
                        skipInputConvert = 1;
                    }
                    else
                    {
                        userInput = bp->tempInputBuffer;
                    }
                }
                else /* user input is not interleaved */
                {
                    destSampleStrideSamples = 1;
                    destChannelStrideBytes = frameCount * bp->bytesPerUserInputSample;

                    /* setup non-interleaved ptrs */
                    if( bp->userInputSampleFormatIsEqualToHost && !bp->hostInputIsInterleaved && bp->hostInputChannels[0][0].data )
                    {
                        for( i=0; i<bp->inputChannelCount; ++i )
                        {
                            bp->tempInputBufferPtrs[i] = hostInputChannels[i].data;
                        }
                        skipInputConvert = 1;
                    }
                    else
                    {
                        for( i=0; i<bp->inputChannelCount; ++i )
                        {
                            bp->tempInputBufferPtrs[i] = ((unsigned char*)bp->tempInputBuffer) +
                                i * bp->bytesPerUserInputSample * frameCount;
                        }
                    }
                
                    userInput = bp->tempInputBufferPtrs;
                }

                if( !bp->hostInputChannels[0][0].data )
                {
                    /* no input was supplied (see PaUtil_SetNoInput), so
                        zero the input buffer */

                    for( i=0; i<bp->inputChannelCount; ++i )
                    {
                        bp->inputZeroer( destBytePtr, destSampleStrideSamples, frameCount );
                        destBytePtr += destChannelStrideBytes;  /* skip to next destination channel */
                    }
                }
                else
	            {
                    if( skipInputConvert )
                    {
                        for( i=0; i<bp->inputChannelCount; ++i )
                        {
                            /* advance src ptr for next iteration */
                            hostInputChannels[i].data = ((unsigned char*)hostInputChannels[i].data) +
                                    frameCount * hostInputChannels[i].stride * bp->bytesPerHostInputSample;
                        }
                    }
                    else
                    {
                        for( i=0; i<bp->inputChannelCount; ++i )
                        {
                            bp->inputConverter( destBytePtr, destSampleStrideSamples,
                                                    hostInputChannels[i].data,
                                                    hostInputChannels[i].stride,
                                                    frameCount, &bp->ditherGenerator );

                            destBytePtr += destChannelStrideBytes;  /* skip to next destination channel */

                            /* advance src ptr for next iteration */
                            hostInputChannels[i].data = ((unsigned char*)hostInputChannels[i].data) +
                                    frameCount * hostInputChannels[i].stride * bp->bytesPerHostInputSample;
                        }
                    }
                }
            }

            /* configure user output buffer */
            if( bp->outputChannelCount == 0 )
            {
                /* no output */
                userOutput = 0;
            }
            else /* there are output channels */
            {
                if( bp->userOutputIsInterleaved )
                {
                    /* process host buffer directly, or use temp buffer if formats differ or host buffer non-interleaved,
                     * or if num channels differs between the host (set in stride) and the user (eg with some Alsa hw:) */
                    if( bp->userOutputSampleFormatIsEqualToHost && bp->hostOutputIsInterleaved
                          && bp->outputChannelCount == hostOutputChannels[0].stride )
                    {
                        userOutput = hostOutputChannels[0].data;
                        skipOutputConvert = 1;
                    }
                    else
                    {
                        userOutput = bp->tempOutputBuffer;
                    }
                }
                else /* user output is not interleaved */
                {
                    if( bp->userOutputSampleFormatIsEqualToHost && !bp->hostOutputIsInterleaved )
                    {
                        for( i=0; i<bp->outputChannelCount; ++i )
                        {
                            bp->tempOutputBufferPtrs[i] = hostOutputChannels[i].data;
                        }
                        skipOutputConvert = 1;
                    }
                    else
                    {
                        for( i=0; i<bp->outputChannelCount; ++i )
                        {
                            bp->tempOutputBufferPtrs[i] = ((unsigned char*)bp->tempOutputBuffer) +
                                i * bp->bytesPerUserOutputSample * frameCount;
                        }
                    }

                    userOutput = bp->tempOutputBufferPtrs;
                }
            }
        
            *streamCallbackResult = bp->streamCallback( userInput, userOutput,
                    frameCount, bp->timeInfo, bp->callbackStatusFlags, bp->userData );

            if( *streamCallbackResult == paAbort )
            {
                /* callback returned paAbort, don't advance framesProcessed
                        and framesToGo, they will be handled below */
            }
            else
            {
                bp->timeInfo->inputBufferAdcTime += frameCount * bp->samplePeriod;
                bp->timeInfo->outputBufferDacTime += frameCount * bp->samplePeriod;

                /* convert output data (user -> host) */
                
                if( bp->outputChannelCount != 0 && bp->hostOutputChannels[0][0].data )
                {
                    if( skipOutputConvert )
					{
						for( i=0; i<bp->outputChannelCount; ++i )
                    	{
                        	/* advance dest ptr for next iteration */
                        	hostOutputChannels[i].data = ((unsigned char*)hostOutputChannels[i].data) +
                            	    frameCount * hostOutputChannels[i].stride * bp->bytesPerHostOutputSample;
                    	}
					}
					else
					{

                    	srcBytePtr = (unsigned char *)bp->tempOutputBuffer;

                    	if( bp->userOutputIsInterleaved )
                    	{
                        	srcSampleStrideSamples = bp->outputChannelCount;
                        	srcChannelStrideBytes = bp->bytesPerUserOutputSample;
                    	}
                    	else /* user output is not interleaved */
                    	{
                        	srcSampleStrideSamples = 1;
                        	srcChannelStrideBytes = frameCount * bp->bytesPerUserOutputSample;
                    	}

                    	for( i=0; i<bp->outputChannelCount; ++i )
                    	{
                        	bp->outputConverter(    hostOutputChannels[i].data,
                                                	hostOutputChannels[i].stride,
                                                	srcBytePtr, srcSampleStrideSamples,
                                                	frameCount, &bp->ditherGenerator );

                        	srcBytePtr += srcChannelStrideBytes;  /* skip to next source channel */

                        	/* advance dest ptr for next iteration */
                        	hostOutputChannels[i].data = ((unsigned char*)hostOutputChannels[i].data) +
                                		frameCount * hostOutputChannels[i].stride * bp->bytesPerHostOutputSample;
                    	}
					}
                }
             
                framesProcessed += frameCount;

                framesToGo -= frameCount;
            }
        }
        while( framesToGo > 0  && *streamCallbackResult == paContinue );
    }

    if( framesToGo > 0 )
    {
        /* zero any remaining frames output. There will only be remaining frames
            if the callback has returned paComplete or paAbort */

        frameCount = framesToGo;

        if( bp->outputChannelCount != 0 && bp->hostOutputChannels[0][0].data )
        {
            for( i=0; i<bp->outputChannelCount; ++i )
            {
                bp->outputZeroer(   hostOutputChannels[i].data,
                                    hostOutputChannels[i].stride,
                                    frameCount );

                /* advance dest ptr for next iteration */
                hostOutputChannels[i].data = ((unsigned char*)hostOutputChannels[i].data) +
                        frameCount * hostOutputChannels[i].stride * bp->bytesPerHostOutputSample;
            }
        }

        framesProcessed += frameCount;
    }

    return framesProcessed;
}